

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

String __thiscall doctest::String::operator+(String *this,String *other)

{
  String *in_RDX;
  String local_20;
  
  String(&local_20,other->m_str);
  operator+=(&local_20,in_RDX);
  String(this,&local_20);
  free(local_20.m_str);
  return (String)(char *)this;
}

Assistant:

String String::operator+(const String& other) const { return String(m_str) += other; }